

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::CheckVersionFile
          (cmFindPackageCommand *this,string *version_file,string *result_version)

{
  cmMakefile *pcVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  byte local_41b;
  byte local_41a;
  allocator local_311;
  string local_310;
  uint local_2ec;
  uint local_2e8;
  uint parsed_tweak;
  uint parsed_patch;
  uint parsed_minor;
  uint parsed_major;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  byte local_262;
  allocator local_261;
  undefined1 local_260 [6];
  bool unsuitable;
  byte local_23b;
  byte local_23a;
  allocator local_239;
  undefined1 local_238 [5];
  bool okay;
  bool suitable;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  char local_178 [8];
  char buf [64];
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  PolicyPushPop local_30;
  PolicyPushPop polScope;
  ScopePushPop varScope;
  string *result_version_local;
  string *version_file_local;
  cmFindPackageCommand *this_local;
  
  cmMakefile::ScopePushPop::ScopePushPop
            ((ScopePushPop *)&polScope,(this->super_cmFindCommon).super_cmCommand.Makefile);
  cmMakefile::PolicyPushPop::PolicyPushPop
            (&local_30,(this->super_cmFindCommon).super_cmCommand.Makefile);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"PACKAGE_VERSION",&local_61);
  cmMakefile::RemoveDefinition(pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"PACKAGE_VERSION_UNSUITABLE",&local_89);
  cmMakefile::RemoveDefinition(pcVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"PACKAGE_VERSION_COMPATIBLE",&local_b1);
  cmMakefile::RemoveDefinition(pcVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"PACKAGE_VERSION_EXACT",&local_d9);
  cmMakefile::RemoveDefinition(pcVar1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"PACKAGE_FIND_NAME",&local_101);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,&local_100,pcVar5);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"PACKAGE_FIND_VERSION",&local_129);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,&local_128,pcVar5);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  sprintf(local_178,"%u",(ulong)this->VersionMajor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"PACKAGE_FIND_VERSION_MAJOR",&local_199);
  cmMakefile::AddDefinition(pcVar1,&local_198,local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  sprintf(local_178,"%u",(ulong)this->VersionMinor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"PACKAGE_FIND_VERSION_MINOR",&local_1c1);
  cmMakefile::AddDefinition(pcVar1,&local_1c0,local_178);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  sprintf(local_178,"%u",(ulong)this->VersionPatch);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"PACKAGE_FIND_VERSION_PATCH",&local_1e9);
  cmMakefile::AddDefinition(pcVar1,&local_1e8,local_178);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  sprintf(local_178,"%u",(ulong)this->VersionTweak);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"PACKAGE_FIND_VERSION_TWEAK",&local_211);
  cmMakefile::AddDefinition(pcVar1,&local_210,local_178);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  sprintf(local_178,"%u",(ulong)this->VersionCount);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_238,"PACKAGE_FIND_VERSION_COUNT",&local_239);
  cmMakefile::AddDefinition(pcVar1,(string *)local_238,local_178);
  std::__cxx11::string::~string((string *)local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  local_23a = 0;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar3 = ReadListFile(this,pcVar5,NoPolicyScope);
  if (bVar3) {
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_260,"PACKAGE_VERSION_EXACT",&local_261);
    bVar3 = cmMakefile::IsOn(pcVar1,(string *)local_260);
    std::__cxx11::string::~string((string *)local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    local_23b = bVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"PACKAGE_VERSION_UNSUITABLE",&local_289);
    bVar3 = cmMakefile::IsOn(pcVar1,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    local_262 = bVar3;
    if (((local_23b & 1) == 0) && ((this->VersionExact & 1U) == 0)) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b0,"PACKAGE_VERSION_COMPATIBLE",&local_2b1);
      local_23b = cmMakefile::IsOn(pcVar1,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    }
    local_41a = 0;
    if ((local_262 & 1) == 0) {
      local_41b = 1;
      if ((local_23b & 1) == 0) {
        local_41b = std::__cxx11::string::empty();
      }
      local_41a = local_41b;
    }
    local_23a = local_41a & 1;
    if (local_23a != 0) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&parsed_major,"PACKAGE_VERSION",(allocator *)((long)&parsed_minor + 3));
      pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&parsed_major);
      std::__cxx11::string::operator=((string *)&this->VersionFound,pcVar5);
      std::__cxx11::string::~string((string *)&parsed_major);
      std::allocator<char>::~allocator((allocator<char> *)((long)&parsed_minor + 3));
      uVar6 = std::__cxx11::string::c_str();
      uVar4 = __isoc99_sscanf(uVar6,"%u.%u.%u.%u",&parsed_patch,&parsed_tweak,&local_2e8,&local_2ec)
      ;
      this->VersionFoundCount = uVar4;
      switch(this->VersionFoundCount) {
      case 4:
        this->VersionFoundTweak = local_2ec;
      case 3:
        this->VersionFoundPatch = local_2e8;
      case 2:
        this->VersionFoundMinor = parsed_tweak;
      case 1:
        this->VersionFoundMajor = parsed_patch;
      }
    }
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"PACKAGE_VERSION",&local_311);
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_310);
  std::__cxx11::string::operator=((string *)result_version,pcVar5);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::__cxx11::string::operator=((string *)result_version,"unknown");
  }
  bVar2 = local_23a;
  cmMakefile::PolicyPushPop::~PolicyPushPop(&local_30);
  cmMakefile::ScopePushPop::~ScopePushPop((ScopePushPop *)&polScope);
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmFindPackageCommand::CheckVersionFile(std::string const& version_file,
                                            std::string& result_version)
{
  // The version file will be loaded in an isolated scope.
  cmMakefile::ScopePushPop varScope(this->Makefile);
  cmMakefile::PolicyPushPop polScope(this->Makefile);
  static_cast<void>(varScope);
  static_cast<void>(polScope);

  // Clear the output variables.
  this->Makefile->RemoveDefinition("PACKAGE_VERSION");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_UNSUITABLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_COMPATIBLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_EXACT");

  // Set the input variables.
  this->Makefile->AddDefinition("PACKAGE_FIND_NAME", this->Name.c_str());
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION",
                                this->Version.c_str());
  char buf[64];
  sprintf(buf, "%u", this->VersionMajor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MAJOR", buf);
  sprintf(buf, "%u", this->VersionMinor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MINOR", buf);
  sprintf(buf, "%u", this->VersionPatch);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_PATCH", buf);
  sprintf(buf, "%u", this->VersionTweak);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_TWEAK", buf);
  sprintf(buf, "%u", this->VersionCount);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_COUNT", buf);

  // Load the version check file.  Pass NoPolicyScope because we do
  // our own policy push/pop independent of CMP0011.
  bool suitable = false;
  if(this->ReadListFile(version_file.c_str(), NoPolicyScope))
    {
    // Check the output variables.
    bool okay = this->Makefile->IsOn("PACKAGE_VERSION_EXACT");
    bool unsuitable = this->Makefile->IsOn("PACKAGE_VERSION_UNSUITABLE");
    if(!okay && !this->VersionExact)
      {
      okay = this->Makefile->IsOn("PACKAGE_VERSION_COMPATIBLE");
      }

    // The package is suitable if the version is okay and not
    // explicitly unsuitable.
    suitable = !unsuitable && (okay || this->Version.empty());
    if(suitable)
      {
      // Get the version found.
      this->VersionFound =
        this->Makefile->GetSafeDefinition("PACKAGE_VERSION");

      // Try to parse the version number and store the results that were
      // successfully parsed.
      unsigned int parsed_major;
      unsigned int parsed_minor;
      unsigned int parsed_patch;
      unsigned int parsed_tweak;
      this->VersionFoundCount =
        sscanf(this->VersionFound.c_str(), "%u.%u.%u.%u",
               &parsed_major, &parsed_minor,
               &parsed_patch, &parsed_tweak);
      switch(this->VersionFoundCount)
        {
        case 4: this->VersionFoundTweak = parsed_tweak; // no break!
        case 3: this->VersionFoundPatch = parsed_patch; // no break!
        case 2: this->VersionFoundMinor = parsed_minor; // no break!
        case 1: this->VersionFoundMajor = parsed_major; // no break!
        default: break;
        }
      }
    }

  result_version = this->Makefile->GetSafeDefinition("PACKAGE_VERSION");
  if (result_version.empty())
    {
    result_version = "unknown";
    }

  // Succeed if the version is suitable.
  return suitable;
}